

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::new_line
          (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this)

{
  pointer pcVar1;
  long *s;
  int iVar2;
  int iVar3;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (this->options_).new_line_chars_._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (this->options_).new_line_chars_._M_string_length);
  s = local_50[0];
  pcVar1 = (this->options_).new_line_chars_._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->options_).new_line_chars_._M_string_length);
  stream_sink<char>::append(&this->sink_,(char *)s,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  iVar2 = this->indent_amount_;
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      stream_sink<char>::push_back(&this->sink_,' ');
      iVar3 = iVar3 + 1;
      iVar2 = this->indent_amount_;
    } while (iVar3 < iVar2);
  }
  this->column_ = (long)iVar2;
  return;
}

Assistant:

void new_line()
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (int i = 0; i < indent_amount_; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = indent_amount_;
        }